

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::CreateProgram::CreateProgram
          (CreateProgram *this,SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program,bool useSync,
          bool serverSync)

{
  Program *this_00;
  undefined1 local_60 [16];
  undefined1 local_50 [54];
  undefined1 local_1a;
  undefined1 local_19;
  bool serverSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> *pSStack_18;
  bool useSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program_local;
  CreateProgram *this_local;
  
  local_1a = serverSync;
  local_19 = useSync;
  pSStack_18 = program;
  program_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)this;
  Operation::Operation(&this->super_Operation,"CreateProgram",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CreateProgram_032678a8;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr(&this->m_program);
  this_00 = (Program *)operator_new(0x90);
  tcu::ThreadUtil::Operation::getEvent((Operation *)local_50);
  Operation::getSync((Operation *)local_60);
  GLES2ThreadTest::Program::Program
            (this_00,(SharedPtr<tcu::ThreadUtil::Event> *)local_50,
             (SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *)local_60);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)(local_50 + 0x10),this_00);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator=
            (pSStack_18,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)(local_50 + 0x10));
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)(local_50 + 0x10));
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *)local_60);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr((SharedPtr<tcu::ThreadUtil::Event> *)local_50);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator=(&this->m_program,pSStack_18);
  return;
}

Assistant:

CreateProgram::CreateProgram (SharedPtr<Program>& program, bool useSync, bool serverSync)
	: Operation	("CreateProgram", useSync, serverSync)
{
	program = SharedPtr<Program>(new Program(getEvent(), getSync()));
	m_program = program;
}